

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::RefEq::finalize(RefEq *this)

{
  bool bVar1;
  bool local_29;
  Type local_28;
  Type local_20;
  BasicType local_18 [2];
  RefEq *local_10;
  RefEq *this_local;
  
  local_18[1] = 1;
  local_10 = this;
  bVar1 = wasm::Type::operator==(&this->left->type,local_18 + 1);
  local_29 = true;
  if (!bVar1) {
    local_18[0] = unreachable;
    local_29 = wasm::Type::operator==(&this->right->type,local_18);
  }
  if (local_29 == false) {
    wasm::Type::Type(&local_28,i32);
    (this->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id =
         local_28.id;
  }
  else {
    wasm::Type::Type(&local_20,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id =
         local_20.id;
  }
  return;
}

Assistant:

void RefEq::finalize() {
  if (left->type == Type::unreachable || right->type == Type::unreachable) {
    type = Type::unreachable;
  } else {
    type = Type::i32;
  }
}